

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

Mat * __thiscall ncnn::ParamDict::get(Mat *__return_storage_ptr__,ParamDict *this,int id,Mat *def)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  anon_struct_112_4_78a8b69f *paVar5;
  
  paVar5 = this->d->params + id;
  if (paVar5->type != 0) {
    def = &paVar5->v;
  }
  __return_storage_ptr__->data = def->data;
  piVar1 = def->refcount;
  __return_storage_ptr__->refcount = piVar1;
  __return_storage_ptr__->elemsize = def->elemsize;
  __return_storage_ptr__->elempack = def->elempack;
  __return_storage_ptr__->allocator = def->allocator;
  iVar2 = def->w;
  iVar3 = def->h;
  iVar4 = def->d;
  __return_storage_ptr__->dims = def->dims;
  __return_storage_ptr__->w = iVar2;
  __return_storage_ptr__->h = iVar3;
  __return_storage_ptr__->d = iVar4;
  __return_storage_ptr__->c = def->c;
  __return_storage_ptr__->cstep = def->cstep;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  return __return_storage_ptr__;
}

Assistant:

Mat ParamDict::get(int id, const Mat& def) const
{
    return d->params[id].type ? d->params[id].v : def;
}